

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_(const_std::error_code_&)>::operator()
          (callback<void_(const_std::error_code_&)> *this,error_code *args)

{
  callable<void_(const_std::error_code_&)> *pcVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *in_RDI;
  bad_callback_call *in_stack_00000010;
  
  pcVar1 = intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::get(in_RDI);
  if (pcVar1 == (callable<void_(const_std::error_code_&)> *)0x0) {
    uVar2 = __cxa_allocate_exception(0x30);
    bad_callback_call::bad_callback_call(in_stack_00000010);
    __cxa_throw(uVar2,&bad_callback_call::typeinfo,bad_callback_call::~bad_callback_call);
  }
  pcVar1 = intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::operator*(in_RDI);
  (*(pcVar1->super_refcounted)._vptr_refcounted[2])(pcVar1,in_RSI);
  return;
}

Assistant:

Result operator()(Params ...args) const			
		{ 								
			if(!call_ptr.get()) throw bad_callback_call();		
			return (*call_ptr)(args...); 		
		}